

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# login_message_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::pixie::LoginMessageTest_test_decode_version1_Test::TestBody
          (LoginMessageTest_test_decode_version1_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  ByteBuffer buffer;
  LoginMessage decoded;
  AssertHelper local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  internal local_178 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  undefined8 *local_168 [6];
  LoginMessage local_138 [296];
  
  bidfx_public_api::tools::BufferUtil::StringAsBuffer((string *)local_168);
  (*(code *)*local_168[0])((string *)local_168);
  bidfx_public_api::price::pixie::LoginMessage::LoginMessage
            (local_138,(ByteBuffer *)local_168,(int)PixieVersion::VERSION1);
  bidfx_public_api::price::pixie::LoginMessage::GetUsername_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_178,"USERNAME","decoded.GetUsername()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &USERNAME_abi_cxx11_,&local_198);
  paVar1 = &local_198.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar1) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_198);
    if (local_170.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_170.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/login_message_test.cpp"
               ,0x5f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    if ((long *)local_198._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_198._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_198._M_dataplus._M_p + 8))();
      }
      local_198._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_170,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bidfx_public_api::price::pixie::LoginMessage::GetPassword_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_178,"PASSWORD","decoded.GetPassword()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &PASSWORD_abi_cxx11_,&local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar1) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_198);
    if (local_170.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_170.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/login_message_test.cpp"
               ,0x60,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    if ((long *)local_198._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_198._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_198._M_dataplus._M_p + 8))();
      }
      local_198._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_170,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bidfx_public_api::price::pixie::LoginMessage::GetAlias_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_178,"ALIAS","decoded.GetAlias()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ALIAS_abi_cxx11_,
             &local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar1) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_198);
    if (local_170.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_170.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/login_message_test.cpp"
               ,0x61,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    if ((long *)local_198._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_198._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_198._M_dataplus._M_p + 8))();
      }
      local_198._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_170,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  LoginMessage::~LoginMessage(local_138);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer((ByteBuffer *)local_168);
  return;
}

Assistant:

TEST(LoginMessageTest, test_decode_version1)
{
    ByteBuffer buffer = BufferUtil::StringAsBuffer(ENCODED_MESSAGE_V1);
    LoginMessage decoded = Decode(buffer, PixieVersion::VERSION1);
    EXPECT_EQ(USERNAME, decoded.GetUsername());
    EXPECT_EQ(PASSWORD, decoded.GetPassword());
    EXPECT_EQ(ALIAS, decoded.GetAlias());
}